

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O1

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
ClearNonEmpty<google::protobuf::internal::GenericTypeHandler<google::protobuf::MessageLite>>
          (RepeatedPtrFieldBase *this)

{
  void **ppvVar1;
  uint uVar2;
  Rep *pRVar3;
  string *psVar4;
  ulong uVar5;
  RepeatedPtrFieldBase *pRVar6;
  ulong uVar7;
  LogMessageFatal local_30 [16];
  
  uVar2 = this->current_size_;
  pRVar6 = this;
  if (((ulong)this->tagged_rep_or_elem_ & 1) != 0) {
    pRVar3 = rep(this);
    pRVar6 = (RepeatedPtrFieldBase *)pRVar3->elements;
  }
  if ((int)uVar2 < 1) {
    psVar4 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                       ((long)(int)uVar2,0,"n > 0");
  }
  else {
    psVar4 = (string *)0x0;
  }
  if (psVar4 == (string *)0x0) {
    uVar5 = 1;
    if (1 < (int)uVar2) {
      uVar5 = (ulong)uVar2;
    }
    uVar7 = 0;
    do {
      ppvVar1 = &pRVar6->tagged_rep_or_elem_ + uVar7;
      uVar7 = uVar7 + 1;
      (**(code **)(**ppvVar1 + 0x10))();
    } while (uVar5 != uVar7);
    this->current_size_ = 0;
    return;
  }
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            (local_30,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/repeated_ptr_field.h"
             ,0x2a8,*(undefined8 *)(psVar4 + 8),*(undefined8 *)psVar4);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_30);
}

Assistant:

PROTOBUF_NOINLINE void ClearNonEmpty() {
    const int n = current_size_;
    void* const* elems = elements();
    int i = 0;
    ABSL_DCHECK_GT(n, 0);
    // do/while loop to avoid initial test because we know n > 0
    do {
      TypeHandler::Clear(cast<TypeHandler>(elems[i++]));
    } while (i < n);
    ExchangeCurrentSize(0);
  }